

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void proto2_unittest::TestParsingMergeLite::SharedDtor(MessageLite *self)

{
  TestAllTypesLite *pTVar1;
  TestParsingMergeLite_OptionalGroup *this;
  Arena *pAVar2;
  LogMessage *pLVar3;
  LogMessage local_30;
  Voidify local_19;
  MessageLite *local_18;
  TestParsingMergeLite *this_;
  MessageLite *self_local;
  
  local_18 = self;
  this_ = (TestParsingMergeLite *)self;
  google::protobuf::internal::InternalMetadata::Delete<std::__cxx11::string>
            (&self->_internal_metadata_);
  pAVar2 = google::protobuf::MessageLite::GetArena(local_18);
  if (pAVar2 == (Arena *)0x0) {
    pTVar1 = (TestAllTypesLite *)local_18[6]._vptr_MessageLite;
    if (pTVar1 != (TestAllTypesLite *)0x0) {
      TestAllTypesLite::~TestAllTypesLite(pTVar1);
      operator_delete(pTVar1,0x348);
    }
    pTVar1 = (TestAllTypesLite *)local_18[6]._internal_metadata_.ptr_;
    if (pTVar1 != (TestAllTypesLite *)0x0) {
      TestAllTypesLite::~TestAllTypesLite(pTVar1);
      operator_delete(pTVar1,0x348);
    }
    this = (TestParsingMergeLite_OptionalGroup *)local_18[7]._vptr_MessageLite;
    if (this != (TestParsingMergeLite_OptionalGroup *)0x0) {
      TestParsingMergeLite_OptionalGroup::~TestParsingMergeLite_OptionalGroup(this);
      operator_delete(this,0x20);
    }
    Impl_::~Impl_((Impl_ *)(local_18 + 1));
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
             ,0x2172,"this_.GetArena() == nullptr");
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

inline void TestParsingMergeLite::SharedDtor(MessageLite& self) {
  TestParsingMergeLite& this_ = static_cast<TestParsingMergeLite&>(self);
  this_._internal_metadata_.Delete<std::string>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.required_all_types_;
  delete this_._impl_.optional_all_types_;
  delete this_._impl_.optionalgroup_;
  this_._impl_.~Impl_();
}